

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_STM_t32(DisasContext_conflict1 *s,arg_ldst_block *a)

{
  undefined1 extraout_AL;
  _Bool _Var1;
  
  if ((a->w != 0) && (((uint)a->list >> (a->rn & 0x1fU) & 1) != 0)) {
    unallocated_encoding_aarch64(s);
    return (_Bool)extraout_AL;
  }
  _Var1 = op_stm(s,a,2);
  return _Var1;
}

Assistant:

static bool trans_STM_t32(DisasContext *s, arg_ldst_block *a)
{
    /* Writeback register in register list is UNPREDICTABLE for T32.  */
    if (a->w && (a->list & (1 << a->rn))) {
        unallocated_encoding(s);
        return true;
    }
    /* BitCount(list) < 2 is UNPREDICTABLE */
    return op_stm(s, a, 2);
}